

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O2

Read<int> __thiscall
Omega_h::binary::swap_bytes<int>(binary *this,Read<int> *array,bool needs_swapping)

{
  undefined7 in_register_00000011;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar1;
  ulong uVar2;
  Read<int> RVar3;
  Write<int> out;
  type f;
  allocator local_61;
  Write<int> local_60;
  Write<int> local_50;
  string local_40;
  Write<int> local_20;
  
  if ((int)CONCAT71(in_register_00000011,needs_swapping) == 0) {
    Write<int>::Write((Write<int> *)this,&array->write_);
    pvVar1 = extraout_RDX;
  }
  else {
    Write<int>::Write(&local_20,&array->write_);
    std::__cxx11::string::string((string *)&local_40,"",&local_61);
    deep_copy<int>((Omega_h *)&local_60,(Read<signed_char> *)&local_20,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    Write<int>::~Write(&local_20);
    Write<int>::Write((Write<int> *)&local_40,&local_60);
    if (((ulong)local_60.shared_alloc_.alloc & 1) == 0) {
      uVar2 = (local_60.shared_alloc_.alloc)->size;
    }
    else {
      uVar2 = (ulong)local_60.shared_alloc_.alloc >> 3;
    }
    parallel_for<Omega_h::binary::swap_bytes<int>(Omega_h::Read<int>,bool)::_lambda(int)_1_>
              ((LO)(uVar2 >> 2),(type *)&local_40,"swap_if_needed");
    Write<int>::Write(&local_50,&local_60);
    Read<int>::Read((Read<signed_char> *)this,&local_50);
    Write<int>::~Write(&local_50);
    Write<int>::~Write((Write<int> *)&local_40);
    Write<int>::~Write(&local_60);
    pvVar1 = extraout_RDX_00;
  }
  RVar3.write_.shared_alloc_.direct_ptr = pvVar1;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar3.write_.shared_alloc_;
}

Assistant:

Read<T> swap_bytes(Read<T> array, bool needs_swapping) {
  if (!needs_swapping) return array;
  Write<T> out = deep_copy(array);
  auto f = OMEGA_H_LAMBDA(LO i) { SwapBytes<T>::swap(&out[i]); };
  parallel_for(out.size(), f, "swap_if_needed");
  return out;
}